

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

ssize_t __thiscall miniros::TransportTCP::write(TransportTCP *this,int __fd,void *__buf,size_t __n)

{
  recursive_mutex *__mutex;
  uint uVar1;
  Level level;
  void *logger_handle;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  size_t __n_00;
  ulong uVar5;
  undefined4 in_register_00000034;
  allocator<char> local_49;
  string local_48;
  
  __mutex = &this->close_mutex_;
  std::recursive_mutex::lock(__mutex);
  if (this->closed_ == true) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (write::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"miniros.transport_tcp",&local_49);
      console::initializeLogLocation(&write::loc,&local_48,Debug);
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (write::loc.level_ != Debug) {
      console::setLogLocationLevel(&write::loc,Debug);
      console::checkLogLocationEnabled(&write::loc);
    }
    if (write::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,write::loc.logger_,write::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x214,"virtual int32_t miniros::TransportTCP::write(uint8_t *, uint32_t)",
                     "Tried to write on a closed socket [%d]",(ulong)(uint)this->sock_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar5 = 0xffffffffffffffff;
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __n_00 = 0x7fffffff;
    if ((uint)__buf < 0x7fffffff) {
      __n_00 = (ulong)__buf & 0xffffffff;
    }
    uVar5 = 0;
    uVar3 = send(this->sock_,(void *)CONCAT44(in_register_00000034,__fd),__n_00,0);
    if ((int)uVar3 < 0) {
      bVar2 = last_socket_error_is_would_block();
      if (bVar2) goto LAB_00266e2c;
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (write(unsigned_char*,unsigned_int)::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"miniros.transport_tcp",&local_49);
        console::initializeLogLocation(&write(unsigned_char*,unsigned_int)::loc,&local_48,Debug);
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (write(unsigned_char*,unsigned_int)::loc.level_ != Debug) {
        console::setLogLocationLevel(&write(unsigned_char*,unsigned_int)::loc,Debug);
        console::checkLogLocationEnabled(&write(unsigned_char*,unsigned_int)::loc);
      }
      logger_handle = write(unsigned_char*,unsigned_int)::loc.logger_;
      level = write(unsigned_char*,unsigned_int)::loc.level_;
      if (write(unsigned_char*,unsigned_int)::loc.logger_enabled_ == true) {
        uVar1 = this->sock_;
        pcVar4 = last_socket_error_string();
        console::print((FilterBase *)0x0,logger_handle,level,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x222,"virtual int32_t miniros::TransportTCP::write(uint8_t *, uint32_t)",
                       "send() on socket [%d] failed with error [%s]",(ulong)uVar1,pcVar4);
      }
      (*(this->super_Transport)._vptr_Transport[8])(this);
    }
    uVar5 = uVar3 & 0xffffffff;
  }
LAB_00266e2c:
  return uVar5 & 0xffffffff;
}

Assistant:

int32_t TransportTCP::write(uint8_t* buffer, uint32_t size)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      MINIROS_DEBUG("Tried to write on a closed socket [%d]", sock_);
      return -1;
    }
  }

  MINIROS_ASSERT(size > 0);

  // never write more than INT_MAX since this is the maximum we can report back with the current return type
  uint32_t writesize = std::min<uint32_t>(size, static_cast<uint32_t>(INT_MAX));
  int num_bytes = ::send(sock_, reinterpret_cast<const char*>(buffer), writesize, 0);
  if (num_bytes < 0)
  {
    if ( !last_socket_error_is_would_block() )
    {
      MINIROS_DEBUG("send() on socket [%d] failed with error [%s]", sock_, last_socket_error_string());
      close();
    }
    else
    {
      num_bytes = 0;
    }
  }

  return num_bytes;
}